

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersect_iterator.hpp
# Opt level: O3

void __thiscall
burst::
intersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_*,_std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>,_std::less<void>_>
::intersect_iterator
          (intersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_*,_std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>,_std::less<void>_>
           *this,__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_*,_std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                 first,
          __normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_*,_std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
          last)

{
  long lVar1;
  __normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_*,_std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  _Var2;
  ulong uVar3;
  undefined8 unaff_RBX;
  
  (this->m_begin)._M_current =
       (iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
        *)0x0;
  (this->m_end)._M_current =
       (iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
        *)0x0;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>*,std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>>>,__gnu_cxx::__ops::_Iter_pred<burst::intersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>*,std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>>>,std::less<void>>::intersect_iterator(__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>*,std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>>>,__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>*,std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>>>,std::less<void>)::_lambda(auto:1_const&)_1_>>
                    (first._M_current,last._M_current);
  if (_Var2._M_current != last._M_current) {
    return;
  }
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>*,std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>>>,__gnu_cxx::__ops::_Iter_negate<burst::intersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>*,std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>>>,std::less<void>>::intersect_iterator(__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>*,std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>>>,__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>*,std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>>>,std::less<void>)::_lambda(auto:1_const&)_2_>>
                    (first._M_current,last._M_current,this);
  if (_Var2._M_current == last._M_current) {
    (this->m_begin)._M_current = first._M_current;
    (this->m_end)._M_current = last._M_current;
    if (first._M_current != last._M_current) {
      uVar3 = (long)last._M_current - (long)first._M_current >> 4;
      lVar1 = 0x3f;
      if (uVar3 != 0) {
        for (; uVar3 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>*,std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<burst::compose_fn<burst::apply_fn<std::less<void>>,burst::compose_fn<burst::by_all_fn<burst::front_t>,burst::forward_as_tuple_fn>>>>
                (first,last,(ulong)(((uint)lVar1 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<burst::compose_fn<burst::apply_fn<std::less<void>_>,_burst::compose_fn<burst::by_all_fn<burst::front_t>,_burst::forward_as_tuple_fn>_>_>
                  )SUB83(unaff_RBX,0));
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>*,std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<burst::compose_fn<burst::apply_fn<std::less<void>>,burst::compose_fn<burst::by_all_fn<burst::front_t>,burst::forward_as_tuple_fn>>>>
                (first,last,
                 (_Iter_comp_iter<burst::compose_fn<burst::apply_fn<std::less<void>_>,_burst::compose_fn<burst::by_all_fn<burst::front_t>,_burst::forward_as_tuple_fn>_>_>
                  )SUB83(unaff_RBX,0));
    }
    settle(this);
    return;
  }
  __assert_fail("(std::all_of(first, last, [this] (const auto & range) { return boost::algorithm::is_sorted(range, m_compare); }))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/intersect_iterator.hpp"
                ,0x77,
                "burst::intersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<int *, std::vector<int>>> *, std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int *, std::vector<int>>>>>>::intersect_iterator(outer_range_iterator, outer_range_iterator, Compare) [RandomAccessIterator = __gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<int *, std::vector<int>>> *, std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int *, std::vector<int>>>>>, Compare = std::less<void>]"
               );
}

Assistant:

explicit intersect_iterator
            (
                outer_range_iterator first, outer_range_iterator last,
                Compare compare = Compare()
            ):
            m_begin{},
            m_end{},
            m_compare(compare)
        {
            if (std::none_of(first, last, [] (const auto & range) {return range.empty();}))
            {
                BOOST_ASSERT((std::all_of(first, last,
                    [this] (const auto & range)
                    {
                        return boost::algorithm::is_sorted(range, m_compare);
                    })));

                m_begin = std::move(first);
                m_end = std::move(last);
                std::sort(m_begin, m_end, each(front) | m_compare);
                settle();
            }
        }